

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_UInt32OptionValueIsNotPositiveInt_Test::
ValidationErrorTest_UInt32OptionValueIsNotPositiveInt_Test
          (ValidationErrorTest_UInt32OptionValueIsNotPositiveInt_Test *this)

{
  ValidationErrorTest_UInt32OptionValueIsNotPositiveInt_Test *this_local;
  
  ValidationErrorTest::ValidationErrorTest(&this->super_ValidationErrorTest);
  (this->super_ValidationErrorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_UInt32OptionValueIsNotPositiveInt_Test_029aa3c0;
  return;
}

Assistant:

TEST_F(ValidationErrorTest, UInt32OptionValueIsNotPositiveInt) {
  BuildDescriptorMessagesInTestPool();

  BuildFileWithErrors(
      "name: \"foo.proto\" "
      "dependency: \"google/protobuf/descriptor.proto\" "
      "extension { name: \"foo\" number: 7672757 label: LABEL_OPTIONAL "
      "            type: TYPE_UINT32 extendee: \"google.protobuf.FileOptions\" }"
      "options { uninterpreted_option { name { name_part: \"foo\" "
      "                                        is_extension: true } "
      "                                 double_value: -5.6 } }",

      "foo.proto: foo.proto: OPTION_VALUE: Value must be integer, from 0 to "
      "4294967295, for uint32 option \"foo\".\n");
}